

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  uint uVar2;
  uint uVar3;
  ulong *puVar4;
  uint extraout_EAX;
  ulong uVar5;
  int *piVar6;
  int queryPlayback;
  int iVar7;
  pollfd *pfds;
  long lVar8;
  pollfd *pfds_00;
  ulong numFrames;
  char *pcVar9;
  uint uVar10;
  int xrun;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  PaError local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong *local_60;
  int local_54;
  ulong local_50;
  int *local_48;
  PaAlsaStreamComponent *local_40;
  PaAlsaStreamComponent *local_38;
  
  local_64 = (uint)((self->playback).pcm != (snd_pcm_t *)0x0);
  local_68 = (uint)((self->capture).pcm != (snd_pcm_t *)0x0);
  local_54 = self->pollTimeout;
  local_6c = 0;
  local_60 = framesAvail;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_68,local_64,framesAvail,&local_6c);
    if (-1 < paUtilErr_) {
      iVar7 = local_6c;
      if (local_6c != 0) {
        local_70 = 0;
        goto LAB_0010ece3;
      }
      if (*local_60 != 0) {
        local_70 = 0;
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          (self->capture).ready = 1;
        }
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          (self->playback).ready = 1;
        }
        goto LAB_0010ece3;
      }
      goto LAB_0010e85d;
    }
    pcVar9 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_0010e85d:
    local_40 = &self->capture;
    local_70 = 0;
    local_48 = xrunOccurred;
    if (local_64 != 0 || local_68 != 0) {
      local_38 = &self->playback;
      local_70 = 0;
      local_50 = 0;
LAB_0010e8a9:
      uVar3 = local_64;
      uVar2 = local_68;
      pthread_testcancel();
      if (uVar2 == 0) {
        uVar10 = 0;
        pfds = (pollfd *)0x0;
      }
      else {
        pfds = self->pfds;
        PaAlsaStreamComponent_BeginPolling(local_40,pfds);
        paUtilErr_ = 0;
        uVar10 = (self->capture).nfds;
      }
      if (uVar3 == 0) {
        pfds_00 = (pollfd *)0x0;
      }
      else {
        if (uVar2 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)(self->capture).nfds;
        }
        pfds_00 = self->pfds + uVar5;
        PaAlsaStreamComponent_BeginPolling(local_38,pfds_00);
        paUtilErr_ = 0;
        uVar10 = uVar10 + (self->playback).nfds;
      }
      uVar10 = poll((pollfd *)self->pfds,(long)(int)uVar10,local_54);
      if ((int)uVar10 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 == 4) {
          Pa_Sleep(1);
          lVar8 = 6;
          uVar10 = extraout_EAX;
          goto LAB_0010eac9;
        }
        paUtilErr_ = -0x2702;
        pcVar9 = 
        "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3821\n"
        ;
LAB_0010ea20:
        PaUtil_DebugPrint(pcVar9);
        lVar8 = 4;
        local_70 = paUtilErr_;
        uVar10 = paUtilErr_;
      }
      else {
        if (uVar10 != 0) {
          if ((uVar2 == 0) ||
             (uVar10 = PaAlsaStreamComponent_EndPolling(local_40,pfds,(int *)&local_68,&local_6c),
             paUtilErr_ = uVar10, -1 < (int)uVar10)) {
            if ((uVar3 == 0) ||
               (uVar10 = PaAlsaStreamComponent_EndPolling
                                   (local_38,pfds_00,(int *)&local_64,&local_6c),
               paUtilErr_ = uVar10, -1 < (int)uVar10)) {
              local_50 = 0;
              lVar8 = 7;
              if (local_6c == 0) goto LAB_0010ea40;
              goto LAB_0010eac9;
            }
            local_50 = 0;
            pcVar9 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
            ;
          }
          else {
            local_50 = 0;
            pcVar9 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3856\n"
            ;
          }
          goto LAB_0010ea20;
        }
        iVar7 = (int)local_50;
        if (0 < iVar7) {
          Pa_Sleep(1);
        }
        uVar10 = iVar7 + 1;
        local_50 = (ulong)uVar10;
        if (iVar7 < 0x7ff) {
LAB_0010ea40:
          lVar8 = 0;
          if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
             ((self->playback).pcm != (snd_pcm_t *)0x0)) {
            if (local_64 == 0 && local_68 != 0) {
              lVar8 = 0;
              paUtilErr_ = ContinuePoll(self,StreamDirection_In,&local_54,(int *)&local_68);
              uVar10 = paUtilErr_;
              if (paUtilErr_ < 0) {
                pcVar9 = 
                "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3876\n"
                ;
                goto LAB_0010ea20;
              }
            }
            else {
              uVar10 = CONCAT31((int3)(local_68 >> 8),local_68 != 0 || local_64 == 0);
              if ((local_68 == 0 && local_64 != 0) &&
                 (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&local_54,(int *)&local_64),
                 lVar8 = 0, uVar10 = paUtilErr_, paUtilErr_ < 0)) {
                pcVar9 = 
                "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3880\n"
                ;
                goto LAB_0010ea20;
              }
            }
          }
        }
        else {
          *local_60 = 0;
          local_6c = 1;
          lVar8 = 5;
        }
      }
LAB_0010eac9:
      if (7 < (uint)lVar8) {
switchD_0010eae2_caseD_1:
        return uVar10;
      }
      uVar10 = (&switchD_0010eae2::switchdataD_00115320)[lVar8] + 0x115320;
      switch(lVar8) {
      case 0:
      case 6:
        goto switchD_0010eae2_caseD_0;
      default:
        goto switchD_0010eae2_caseD_1;
      case 4:
      case 5:
        goto switchD_0010eae2_caseD_4;
      case 7:
        break;
      }
    }
switchD_0010eae2_caseD_7:
    xrunOccurred = local_48;
    if (local_6c != 0) {
switchD_0010eae2_caseD_4:
      iVar7 = local_6c;
      xrunOccurred = local_48;
      goto LAB_0010ece3;
    }
    queryPlayback = 0;
    iVar7 = 0;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      iVar7 = (self->capture).ready;
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      queryPlayback = (self->playback).ready;
    }
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar7,queryPlayback,local_60,&local_6c);
    puVar4 = local_60;
    if (-1 < paUtilErr_) {
      psVar1 = (self->capture).pcm;
      iVar7 = local_6c;
      if (psVar1 != (snd_pcm_t *)0x0) {
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          if (((self->playback).ready == 0) && (self->neverDropInput == 0)) {
            if ((self->capture).ready == 0) {
              __assert_fail("self->capture.ready",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xf3d,
                            "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            uVar5 = (self->capture).framesPerPeriod;
            numFrames = *local_60;
            if (uVar5 < *local_60) {
              numFrames = uVar5;
            }
            PaAlsaStreamComponent_EndProcessing(local_40,numFrames,&local_6c);
            *puVar4 = 0;
            (self->capture).ready = 0;
            iVar7 = local_6c;
          }
          goto LAB_0010ece3;
        }
        if (psVar1 != (snd_pcm_t *)0x0) {
          if ((self->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf45,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
          goto LAB_0010ece3;
        }
      }
      if ((self->playback).ready == 0) {
        __assert_fail("self->playback.ready",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xf47,
                      "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
      }
      goto LAB_0010ece3;
    }
    pcVar9 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3894\n"
    ;
  }
  PaUtil_DebugPrint(pcVar9);
  local_70 = paUtilErr_;
  iVar7 = local_6c;
LAB_0010ece3:
  while( true ) {
    while (iVar7 == 0) {
      if (((*local_60 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
      goto LAB_0010ed4e;
      PaUtil_DebugPrint(
                       "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3927\n"
                       );
      local_70 = -0x2702;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(self);
    if (-1 < paUtilErr_) break;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3919\n"
                     );
    local_70 = paUtilErr_;
  }
  *local_60 = 0;
LAB_0010ed4e:
  *xrunOccurred = iVar7;
  return local_70;
switchD_0010eae2_caseD_0:
  if (local_68 == 0 && local_64 == 0) goto switchD_0010eae2_caseD_7;
  goto LAB_0010e8a9;
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

        pollResults = poll( self->pfds, totalFds, pollTimeout );

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}